

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O2

bool __thiscall
llvm::yaml::Scanner::scanBlockScalarHeader
          (Scanner *this,char *ChompingIndicator,uint *IndentIndicator,bool *IsDone)

{
  iterator pcVar1;
  char cVar2;
  bool bVar3;
  uint uVar4;
  iterator Position;
  iterator pcVar5;
  bool bVar6;
  Child local_68;
  iterator local_60;
  long local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  undefined8 local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pcVar1 = this->Current;
  cVar2 = scanBlockChompingIndicator(this);
  *ChompingIndicator = cVar2;
  uVar4 = scanBlockIndentationIndicator(this);
  *IndentIndicator = uVar4;
  if (*ChompingIndicator == ' ') {
    cVar2 = scanBlockChompingIndicator(this);
    *ChompingIndicator = cVar2;
  }
  Position = this->Current;
  do {
    pcVar5 = skip_s_white(this,Position);
    bVar6 = pcVar5 != Position;
    Position = pcVar5;
  } while (bVar6);
  this->Current = pcVar5;
  skipComment(this);
  if (this->Current == this->End) {
    local_50 = &local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    local_68.decUI = 0x13;
    local_58 = (long)this->Current - (long)pcVar1;
    local_60 = pcVar1;
    AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
    ::push_back(&this->TokenQueue,(Token *)&local_68);
    *IsDone = true;
    std::__cxx11::string::~string((string *)&local_50);
    bVar6 = true;
  }
  else {
    bVar3 = consumeLineBreakIfPresent(this);
    bVar6 = true;
    if (!bVar3) {
      Twine::Twine((Twine *)&local_68,"Expected a line break after block scalar header");
      setError(this,(Twine *)&local_68,this->Current);
      bVar6 = false;
    }
  }
  return bVar6;
}

Assistant:

bool Scanner::scanBlockScalarHeader(char &ChompingIndicator,
                                    unsigned &IndentIndicator, bool &IsDone) {
  auto Start = Current;

  ChompingIndicator = scanBlockChompingIndicator();
  IndentIndicator = scanBlockIndentationIndicator();
  // Check for the chomping indicator once again.
  if (ChompingIndicator == ' ')
    ChompingIndicator = scanBlockChompingIndicator();
  Current = skip_while(&Scanner::skip_s_white, Current);
  skipComment();

  if (Current == End) { // EOF, we have an empty scalar.
    Token T;
    T.Kind = Token::TK_BlockScalar;
    T.Range = StringRef(Start, Current - Start);
    TokenQueue.push_back(T);
    IsDone = true;
    return true;
  }

  if (!consumeLineBreakIfPresent()) {
    setError("Expected a line break after block scalar header", Current);
    return false;
  }
  return true;
}